

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::Trim(ON_PolylineCurve *this,ON_Interval *domain)

{
  ON_SimpleArray<double> *m_t;
  uint uVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  ON_3dPoint *pOVar13;
  uint uVar14;
  int iVar15;
  double dVar16;
  int s1;
  ON_Interval actual_trim_domain;
  int s0;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_Interval output_domain;
  ON_Interval seg_domain;
  ON_Line seg_chord;
  ON_Interval original_polyline_domain;
  uint local_114;
  double local_110;
  ON_Interval local_108;
  uint local_f4;
  double local_f0;
  ON_3dPoint local_e8;
  ON_3dPoint local_c8;
  ON_Interval local_a8;
  ON_3dPoint local_90;
  ON_Interval local_78;
  ON_Line local_68;
  ON_Interval local_38;
  
  uVar1 = (this->m_t).m_count;
  if ((int)uVar1 < 2) {
    return false;
  }
  if (uVar1 != (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count) {
    return false;
  }
  bVar9 = ON_Interval::IsIncreasing(domain);
  if (!bVar9) {
    return false;
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  bVar9 = ON_Interval::IsIncreasing(&local_38);
  if (!bVar9) {
    return false;
  }
  local_a8.m_t[0] = domain->m_t[0];
  local_a8.m_t[1] = domain->m_t[1];
  bVar9 = ON_Interval::Intersection(&local_a8,&local_38);
  if (!bVar9) {
    return false;
  }
  bVar9 = ON_Interval::IsIncreasing(&local_a8);
  if (!bVar9) {
    return false;
  }
  m_t = &this->m_t;
  local_108.m_t[0] = local_a8.m_t[0];
  local_108.m_t[1] = local_a8.m_t[1];
  local_f4 = 0xfffffffe;
  local_114 = 0xfffffffd;
  pdVar10 = ON_Interval::operator[](&local_a8,0);
  bVar9 = ON_Curve::ParameterSearch
                    (&this->super_ON_Curve,*pdVar10,(int *)&local_f4,true,m_t,1.490116119385e-08);
  if (local_f4 < uVar1 && bVar9) {
    local_110 = (this->m_t).m_a[local_f4];
    pdVar10 = ON_Interval::operator[](&local_108,0);
    *pdVar10 = local_110;
  }
  pdVar10 = ON_Interval::operator[](&local_a8,1);
  bVar9 = ON_Curve::ParameterSearch
                    (&this->super_ON_Curve,*pdVar10,(int *)&local_114,true,m_t,1.490116119385e-08);
  if (local_114 < uVar1 && bVar9) {
    local_110 = (this->m_t).m_a[local_114];
    pdVar10 = ON_Interval::operator[](&local_108,1);
    *pdVar10 = local_110;
    local_114 = local_114 - 1;
  }
  bVar9 = ON_Interval::IsIncreasing(&local_108);
  if (!bVar9) {
    return false;
  }
  if ((int)local_f4 < 0) {
    return false;
  }
  uVar14 = uVar1 - 1;
  if ((int)uVar14 <= (int)local_114 || (int)local_114 < (int)local_f4) {
    return false;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  bVar9 = ON_Interval::operator==(&local_108,&local_38);
  if (bVar9) {
    pdVar10 = ON_Interval::operator[](&local_a8,0);
    *(this->m_t).m_a = *pdVar10;
    pdVar10 = ON_Interval::operator[](&local_a8,1);
    (this->m_t).m_a[uVar14] = *pdVar10;
    return true;
  }
  if ((int)local_114 < (int)(uVar1 - 2)) {
    iVar15 = local_114 + 2;
    if ((-3 < (int)local_114) && (iVar15 <= (this->m_t).m_capacity)) {
      (this->m_t).m_count = iVar15;
    }
    if ((-3 < (int)local_114) &&
       (iVar15 <= (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_capacity)
       ) {
      (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count = iVar15;
    }
    uVar14 = local_114 + 1;
  }
  uVar12 = (ulong)local_f4;
  if (0 < (int)local_f4) {
    if ((int)local_f4 <= (int)uVar14) {
      pOVar13 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
      pdVar10 = (this->m_t).m_a;
      iVar15 = local_f4 - 1;
      do {
        *pdVar10 = pdVar10[uVar12];
        pOVar13->z = pOVar13[uVar12].z;
        dVar16 = pOVar13[uVar12].y;
        pOVar13->x = pOVar13[uVar12].x;
        pOVar13->y = dVar16;
        iVar15 = iVar15 + 1;
        pOVar13 = pOVar13 + 1;
        pdVar10 = pdVar10 + 1;
      } while (iVar15 < (int)uVar14);
    }
    local_114 = local_114 - local_f4;
    local_f4 = 0;
    iVar15 = local_114 + 2;
    if ((-3 < (int)local_114) && (iVar15 <= (this->m_t).m_capacity)) {
      (this->m_t).m_count = iVar15;
    }
    if ((-3 < (int)local_114) &&
       (iVar15 <= (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_capacity)
       ) {
      (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count = iVar15;
    }
  }
  local_110 = *(this->m_t).m_a;
  pdVar10 = ON_Interval::operator[](&local_108,0);
  bVar9 = true;
  if (*pdVar10 <= local_110) {
    if (local_114 == 0) {
      pdVar10 = ON_Interval::operator[](&local_108,1);
      dVar16 = (this->m_t).m_a[1];
      bVar9 = *pdVar10 <= dVar16 && dVar16 != *pdVar10;
    }
    else {
      bVar9 = false;
    }
  }
  if ((int)local_f4 < (int)local_114) {
    local_110 = (this->m_t).m_a[(int)local_114];
    pdVar10 = ON_Interval::operator[](&local_108,1);
    if (local_110 < *pdVar10) {
      pdVar10 = ON_Interval::operator[](&local_108,1);
      dVar16 = (this->m_t).m_a[(long)(int)local_114 + 1];
      bVar3 = *pdVar10 <= dVar16 && dVar16 != *pdVar10;
      goto LAB_00591f8d;
    }
  }
  bVar3 = false;
LAB_00591f8d:
  if (bVar9) {
    pdVar10 = (this->m_t).m_a;
    ON_Interval::ON_Interval(&local_78,*pdVar10,pdVar10[1]);
    pOVar13 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    local_c8.z = pOVar13->z;
    local_c8.x = pOVar13->x;
    local_c8.y = pOVar13->y;
    local_e8.z = pOVar13[1].z;
    local_e8.x = pOVar13[1].x;
    local_e8.y = pOVar13[1].y;
    ON_Line::ON_Line(&local_68,*pOVar13,pOVar13[1]);
    local_f0 = *(this->m_t).m_a;
    pdVar10 = ON_Interval::operator[](&local_108,0);
    local_110 = 0.0;
    if ((*pdVar10 <= local_f0) ||
       (pdVar10 = ON_Interval::operator[](&local_108,0), dVar16 = (this->m_t).m_a[1],
       dVar16 < *pdVar10 || dVar16 == *pdVar10)) {
      bVar9 = false;
    }
    else {
      pdVar10 = ON_Interval::operator[](&local_108,0);
      local_110 = ON_Interval::NormalizedParameterAt(&local_78,*pdVar10);
      ON_Line::PointAt(&local_90,&local_68,local_110);
      local_c8.z = local_90.z;
      local_c8.x = local_90.x;
      local_c8.y = local_90.y;
      bVar9 = true;
    }
    if (local_114 == 0) {
      local_f0 = *(this->m_t).m_a;
      pdVar10 = ON_Interval::operator[](&local_108,1);
      if ((*pdVar10 <= local_f0) ||
         (pdVar10 = ON_Interval::operator[](&local_108,1), dVar16 = (this->m_t).m_a[1],
         dVar16 < *pdVar10 || dVar16 == *pdVar10)) {
        bVar4 = false;
        dVar16 = 1.0;
      }
      else {
        pdVar10 = ON_Interval::operator[](&local_108,1);
        local_f0 = ON_Interval::NormalizedParameterAt(&local_78,*pdVar10);
        ON_Line::PointAt(&local_90,&local_68,local_f0);
        local_e8.z = local_90.z;
        local_e8.x = local_90.x;
        local_e8.y = local_90.y;
        bVar4 = true;
        dVar16 = local_f0;
      }
    }
    else {
      bVar4 = false;
      dVar16 = 1.0;
    }
    if (dVar16 <= local_110) {
      ON_Line::~ON_Line(&local_68);
      return false;
    }
    if (bVar9) {
      if (((0.9999999850988388 <= local_110) &&
          (dVar16 = ON_3dPoint::DistanceTo(&local_c8,&local_e8), dVar16 <= 2.3283064365386963e-10))
         && (0 < (int)local_114)) {
        local_110 = (this->m_t).m_a[1];
        pdVar10 = ON_Interval::operator[](&local_108,1);
        if (local_110 < *pdVar10) {
          ON_SimpleArray<double>::Remove(m_t,0);
          ON_SimpleArray<ON_3dPoint>::Remove((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
          local_114 = local_114 - 1;
          local_110 = *(this->m_t).m_a;
          pdVar10 = ON_Interval::operator[](&local_108,0);
          *pdVar10 = local_110;
        }
      }
      pdVar10 = ON_Interval::operator[](&local_108,0);
      *(this->m_t).m_a = *pdVar10;
      pOVar13 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
      pOVar13->z = local_c8.z;
      pOVar13->x = local_c8.x;
      pOVar13->y = local_c8.y;
    }
    if (bVar4) {
      pdVar10 = ON_Interval::operator[](&local_108,1);
      (this->m_t).m_a[1] = *pdVar10;
      pOVar13 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
      pOVar13[1].z = local_e8.z;
      pOVar13[1].x = local_e8.x;
      pOVar13[1].y = local_e8.y;
    }
    ON_Line::~ON_Line(&local_68);
  }
  if (bVar3) {
    pdVar10 = (this->m_t).m_a;
    ON_Interval::ON_Interval(&local_78,pdVar10[(int)local_114],pdVar10[(long)(int)local_114 + 1]);
    lVar11 = (long)(int)local_114;
    pOVar2 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar13 = pOVar2 + lVar11;
    local_c8.x = pOVar13->x;
    local_c8.y = pOVar13->y;
    uVar5 = pOVar13->x;
    uVar6 = pOVar13->y;
    from_pt.y = (double)uVar6;
    from_pt.x = (double)uVar5;
    local_c8.z = pOVar2[lVar11].z;
    local_e8.z = pOVar2[lVar11 + 1].z;
    pOVar2 = pOVar2 + lVar11 + 1;
    local_e8.x = pOVar2->x;
    local_e8.y = pOVar2->y;
    uVar7 = pOVar2->x;
    uVar8 = pOVar2->y;
    to_pt.y = (double)uVar8;
    to_pt.x = (double)uVar7;
    from_pt.z = local_c8.z;
    to_pt.z = local_e8.z;
    ON_Line::ON_Line(&local_68,from_pt,to_pt);
    pdVar10 = ON_Interval::operator[](&local_108,1);
    local_110 = ON_Interval::NormalizedParameterAt(&local_78,*pdVar10);
    ON_Line::PointAt(&local_90,&local_68,local_110);
    local_e8.z = local_90.z;
    local_e8.x = local_90.x;
    local_e8.y = local_90.y;
    if ((local_110 <= 1.490116119385e-08) &&
       (dVar16 = ON_3dPoint::DistanceTo(&local_e8,&local_c8),
       0 < (int)local_114 && dVar16 <= 2.3283064365386963e-10)) {
      uVar12 = (ulong)local_114;
      if ((int)local_114 <
          (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
        (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count =
             local_114 + 1;
      }
      if ((int)local_114 < (this->m_t).m_capacity) {
        (this->m_t).m_count = local_114 + 1;
      }
      local_114 = local_114 - 1;
      local_110 = (this->m_t).m_a[uVar12];
      pdVar10 = ON_Interval::operator[](&local_108,1);
      *pdVar10 = local_110;
    }
    pdVar10 = ON_Interval::operator[](&local_108,1);
    lVar11 = (long)(int)local_114;
    (this->m_t).m_a[lVar11 + 1] = *pdVar10;
    pOVar13 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar13[lVar11 + 1].z = local_e8.z;
    pOVar13 = pOVar13 + lVar11 + 1;
    pOVar13->x = local_e8.x;
    pOVar13->y = local_e8.y;
    ON_Line::~ON_Line(&local_68);
  }
  pdVar10 = ON_Interval::operator[](&local_a8,0);
  *(this->m_t).m_a = *pdVar10;
  pdVar10 = ON_Interval::operator[](&local_a8,1);
  (this->m_t).m_a[(long)(this->m_t).m_count + -1] = *pdVar10;
  return true;
}

Assistant:

bool
ON_PolylineCurve::SwapCoordinates( int i, int j )
{
	DestroyCurveTree();
  return m_pline.SwapCoordinates(i,j);
}